

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

_Bool checkhttpprefix(SessionHandle *data,char *s)

{
  char *__s;
  int iVar1;
  size_t max;
  curl_slist *pcVar2;
  
  pcVar2 = (data->set).http200aliases;
  while( true ) {
    if (pcVar2 == (curl_slist *)0x0) {
      iVar1 = Curl_raw_nequal("HTTP/",s,5);
      return iVar1 != 0;
    }
    __s = pcVar2->data;
    max = strlen(__s);
    iVar1 = Curl_raw_nequal(__s,s,max);
    if (iVar1 != 0) break;
    pcVar2 = pcVar2->next;
  }
  return true;
}

Assistant:

static bool
checkhttpprefix(struct SessionHandle *data,
                const char *s)
{
  struct curl_slist *head = data->set.http200aliases;
  bool rc = FALSE;
#ifdef CURL_DOES_CONVERSIONS
  /* convert from the network encoding using a scratch area */
  char *scratch = strdup(s);
  if(NULL == scratch) {
    failf (data, "Failed to allocate memory for conversion!");
    return FALSE; /* can't return CURLE_OUT_OF_MEMORY so return FALSE */
  }
  if(CURLE_OK != Curl_convert_from_network(data, scratch, strlen(s)+1)) {
    /* Curl_convert_from_network calls failf if unsuccessful */
    free(scratch);
    return FALSE; /* can't return CURLE_foobar so return FALSE */
  }
  s = scratch;
#endif /* CURL_DOES_CONVERSIONS */

  while(head) {
    if(checkprefix(head->data, s)) {
      rc = TRUE;
      break;
    }
    head = head->next;
  }

  if(!rc && (checkprefix("HTTP/", s)))
    rc = TRUE;

#ifdef CURL_DOES_CONVERSIONS
  free(scratch);
#endif /* CURL_DOES_CONVERSIONS */
  return rc;
}